

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::removefacebyflips(tetgenmesh *this,triface *flipface,flipconstraints *fc)

{
  bool bVar1;
  int iVar2;
  point pa_00;
  point pb_00;
  point pb_01;
  point pc_00;
  point pd_00;
  double dVar3;
  triface *local_a8;
  int reducflag;
  double ori;
  point pe;
  point pd;
  point pc;
  point pb;
  point pa;
  triface flipedge;
  triface fliptets [3];
  flipconstraints *fc_local;
  triface *flipface_local;
  tetgenmesh *this_local;
  
  local_a8 = (triface *)&flipedge.ver;
  fliptets[2]._8_8_ = fc;
  do {
    triface::triface(local_a8);
    local_a8 = local_a8 + 1;
  } while (local_a8 != (triface *)&fliptets[2].ver);
  triface::triface((triface *)&pa);
  bVar1 = false;
  triface::operator=((triface *)&flipedge.ver,flipface);
  fsym(this,flipface,(triface *)&fliptets[0].ver);
  pa_00 = org(this,(triface *)&flipedge.ver);
  pb_00 = dest(this,(triface *)&flipedge.ver);
  pb_01 = apex(this,(triface *)&flipedge.ver);
  pc_00 = oppo(this,(triface *)&flipedge.ver);
  pd_00 = oppo(this,(triface *)&fliptets[0].ver);
  dVar3 = orient3d(pa_00,pb_00,pc_00,pd_00);
  if (dVar3 <= 0.0) {
    triface::operator=((triface *)&pa,flipface);
  }
  else {
    dVar3 = orient3d(pb_00,pb_01,pc_00,pd_00);
    if (dVar3 <= 0.0) {
      enext(this,flipface,(triface *)&pa);
    }
    else {
      dVar3 = orient3d(pb_01,pa_00,pc_00,pd_00);
      if (dVar3 <= 0.0) {
        eprev(this,flipface,(triface *)&pa);
      }
      bVar1 = dVar3 > 0.0;
    }
  }
  if (bVar1) {
    flip23(this,(triface *)&flipedge.ver,0,(flipconstraints *)fliptets[2]._8_8_);
    this_local._4_4_ = 1;
  }
  else {
    iVar2 = removeedgebyflips(this,(triface *)&pa,(flipconstraints *)fliptets[2]._8_8_);
    if (iVar2 == 2) {
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int tetgenmesh::removefacebyflips(triface *flipface, flipconstraints* fc)
{
  triface fliptets[3], flipedge;
  point pa, pb, pc, pd, pe;
  REAL ori;
  int reducflag = 0;

  fliptets[0] = *flipface;
  fsym(*flipface, fliptets[1]);
  pa = org(fliptets[0]);
  pb = dest(fliptets[0]);
  pc = apex(fliptets[0]);
  pd = oppo(fliptets[0]);
  pe = oppo(fliptets[1]);

  ori = orient3d(pa, pb, pd, pe);
  if (ori > 0) {
    ori = orient3d(pb, pc, pd, pe);
    if (ori > 0) {
      ori = orient3d(pc, pa, pd, pe);
      if (ori > 0) {
        // Found a 2-to-3 flip.
        reducflag = 1;
      } else {
        eprev(*flipface, flipedge); // [c,a]
      }
    } else {
      enext(*flipface, flipedge); // [b,c]
    }
  } else {
    flipedge = *flipface; // [a,b]
  }

  if (reducflag) {
    // A 2-to-3 flip is found.
    flip23(fliptets, 0, fc);
    return 1;
  } else {
    // Try to flip the selected edge of this face.
    if (removeedgebyflips(&flipedge, fc) == 2) {
      return 1;
    }
  }

  // Face is not removed.
  return 0;
}